

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseTemplateArgs(State *state)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  undefined1 uVar4;
  State *in_RDI;
  ParseState copy;
  ComplexityGuard guard;
  ParseFunc in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined8 uVar5;
  State *in_stack_ffffffffffffffd8;
  ComplexityGuard local_18;
  State *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_18,in_RDI);
  bVar3 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_18);
  if (bVar3) {
    local_1 = 0;
  }
  else {
    iVar1 = (local_10->parse_state).mangled_idx;
    iVar2 = (local_10->parse_state).out_cur_idx;
    uVar5 = *(undefined8 *)&(local_10->parse_state).prev_name_idx;
    DisableAppend(local_10);
    bVar3 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar5 >> 0x38));
    if ((bVar3) && (bVar3 = OneOrMore(in_stack_ffffffffffffffa8,(State *)0x3b1465), bVar3)) {
      bVar3 = ParseQRequiresClauseExpr(in_stack_ffffffffffffffd8);
      bVar3 = Optional(bVar3);
      if ((bVar3) &&
         (uVar4 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar5 >> 0x38)),
         (bool)uVar4)) {
        RestoreAppend(local_10,SUB81((ulong)uVar5 >> 0x3f,0));
        MaybeAppend((State *)CONCAT17(uVar4,in_stack_ffffffffffffffb0),
                    (char *)in_stack_ffffffffffffffa8);
        local_1 = 1;
        goto LAB_003b1537;
      }
    }
    (local_10->parse_state).mangled_idx = iVar1;
    (local_10->parse_state).out_cur_idx = iVar2;
    *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar5;
    local_1 = 0;
  }
LAB_003b1537:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_18);
  return (bool)(local_1 & 1);
}

Assistant:

static bool ParseTemplateArgs(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  DisableAppend(state);
  if (ParseOneCharToken(state, 'I') && OneOrMore(ParseTemplateArg, state) &&
      Optional(ParseQRequiresClauseExpr(state)) &&
      ParseOneCharToken(state, 'E')) {
    RestoreAppend(state, copy.append);
    MaybeAppend(state, "<>");
    return true;
  }
  state->parse_state = copy;
  return false;
}